

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

void __thiscall
Fl_Preferences::RootNode::RootNode
          (RootNode *this,Fl_Preferences *prefs,char *path,char *vendor,char *application)

{
  char *pcVar1;
  void *__buf;
  int __fd;
  char filename [2048];
  char local_828 [2056];
  
  this->prefs_ = prefs;
  this->application_ = (char *)0x0;
  this->filename_ = (char *)0x0;
  this->vendor_ = (char *)0x0;
  if (application == (char *)0x0) {
    pcVar1 = strdup(path);
    __fd = (int)prefs;
    application = "unknown";
  }
  else {
    local_828[0] = '\0';
    __fd = 0x800;
    snprintf(local_828,0x800,"%s/%s.prefs");
    pcVar1 = strdup(local_828);
  }
  this->filename_ = pcVar1;
  pcVar1 = "unknown";
  if (vendor != (char *)0x0) {
    pcVar1 = vendor;
  }
  pcVar1 = strdup(pcVar1);
  this->vendor_ = pcVar1;
  pcVar1 = strdup(application);
  this->application_ = pcVar1;
  read(this,__fd,__buf,(size_t)path);
  return;
}

Assistant:

Fl_Preferences::RootNode::RootNode( Fl_Preferences *prefs, const char *path, const char *vendor, const char *application )
: prefs_(prefs),
  filename_(0L),
  vendor_(0L),
  application_(0L) {

  if (!vendor)
    vendor = "unknown";
  if (!application) {
    application = "unknown";
    filename_ = strdup(path);
  } else {
    char filename[ FL_PATH_MAX ]; filename[0] = 0;
    snprintf(filename, sizeof(filename), "%s/%s.prefs", path, application);
    filename_  = strdup(filename);
  }
  vendor_      = strdup(vendor);
  application_ = strdup(application); 
  read();
}